

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver.cpp
# Opt level: O0

int __thiscall QLocalServer::listen(QLocalServer *this,int __fd,int __n)

{
  QLatin1StringView latin1;
  bool bVar1;
  uint uVar2;
  QLocalServerPrivate *this_00;
  int __n_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  QLocalServerPrivate *d;
  QString function;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  QMessageLogger *in_stack_ffffffffffffff60;
  undefined1 auVar4 [12];
  QLocalServer *pQVar5;
  undefined5 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8d;
  undefined1 uVar6;
  QChar in_stack_ffffffffffffff8e;
  QChar in_stack_ffffffffffffff9e;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = this;
  this_00 = d_func((QLocalServer *)0x37c815);
  bVar1 = isListening((QLocalServer *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
  ;
  if (bVar1) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff60,(char *)this,in_stack_ffffffffffffff54,
               (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QMessageLogger::warning(local_28,"QLocalServer::listen() called when already listening");
    uVar6 = 0;
  }
  else {
    bVar1 = QString::isEmpty((QString *)0x37c86a);
    if (bVar1) {
      this_00->error = HostNotFoundError;
      QVar3 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)this,CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50))
      ;
      latin1.m_data._0_5_ = in_stack_ffffffffffffff88;
      latin1.m_size = (qsizetype)pQVar5;
      latin1.m_data._5_1_ = in_stack_ffffffffffffff8d;
      latin1.m_data._6_2_ = in_stack_ffffffffffffff8e.ucs;
      QString::QString((QString *)QVar3.m_size,latin1);
      auVar4 = QVar3._4_12_;
      tr((char *)this,(char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
         in_stack_ffffffffffffff4c);
      QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffff8e,L' ');
      QString::arg<QString,_true>
                ((QString *)this_00,auVar4._4_8_,auVar4._0_4_,in_stack_ffffffffffffff9e);
      QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (QString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      QString::~QString((QString *)0x37c940);
      QString::~QString((QString *)0x37c94a);
      uVar6 = 0;
      QString::~QString((QString *)0x37c959);
    }
    else {
      uVar2 = QLocalServerPrivate::listen(this_00,__fd,__n_00);
      if ((uVar2 & 1) == 0) {
        QString::clear((QString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        QString::clear((QString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        uVar6 = 0;
      }
      else {
        QString::operator=(&this_00->serverName,(QString *)CONCAT44(in_register_00000034,__fd));
        uVar6 = 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),uVar6) & 0xffffff01;
  }
  __stack_chk_fail();
}

Assistant:

bool QLocalServer::listen(const QString &name)
{
    Q_D(QLocalServer);
    if (isListening()) {
        qWarning("QLocalServer::listen() called when already listening");
        return false;
    }

    if (name.isEmpty()) {
        d->error = QAbstractSocket::HostNotFoundError;
        QString function = "QLocalServer::listen"_L1;
        d->errorString = tr("%1: Name error").arg(function);
        return false;
    }

    if (!d->listen(name)) {
        d->serverName.clear();
        d->fullServerName.clear();
        return false;
    }

    d->serverName = name;
    return true;
}